

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

bool __thiscall cmCPackGenerator::ReadListFile(cmCPackGenerator *this,char *moduleName)

{
  cmMakefile *this_00;
  bool bVar1;
  string fullPath;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  this_00 = this->MakefileMap;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,moduleName,&local_51);
  cmMakefile::GetModulesFile(&local_30,this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar1 = cmMakefile::ReadListFile(this->MakefileMap,&local_30);
  if (bVar1) {
    bVar1 = true;
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar1 = cmSystemTools::GetInterruptFlag();
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmCPackGenerator::ReadListFile(const char* moduleName)
{
  bool retval;
  std::string fullPath = this->MakefileMap->GetModulesFile(moduleName);
  retval = this->MakefileMap->ReadListFile(fullPath);
  // include FATAL_ERROR and ERROR in the return status
  retval = retval && (!cmSystemTools::GetErrorOccurredFlag());
  return retval;
}